

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::TextureSwizzleCase::test
          (TextureSwizzleCase *this,CallLogWrapper *gl,ResultCollector *result)

{
  TesterType tester;
  GLint param;
  uint uVar1;
  TestLog *pTVar2;
  bool bVar3;
  bool bVar4;
  GLenum GVar5;
  long *plVar6;
  undefined8 *puVar7;
  size_type *psVar8;
  GLuint expected;
  ulong uVar9;
  undefined8 uVar10;
  long lVar11;
  ScopedLogSection section;
  GLint value;
  ScopedLogSection section_1;
  string local_f8;
  ScopedLogSection local_d8;
  long local_d0;
  TestLog local_c8;
  long lStack_c0;
  string local_b8;
  ulong *local_98;
  long local_90;
  ulong local_88 [2];
  string local_78;
  ResultCollector *local_58;
  GLuint local_4c;
  code *local_48;
  GLenum local_40;
  ScopedLogSection local_38;
  
  tester = (this->super_TextureTest).m_tester;
  local_58 = result;
  bVar3 = isPureIntTester(tester);
  bVar4 = true;
  if (!bVar3) {
    bVar4 = isPureUintTester(tester);
  }
  GVar5 = (this->super_TextureTest).m_pname;
  uVar1 = GVar5 - 0x753f;
  if (2 < GVar5 - 0x8e42) {
    uVar1 = -(uint)(GVar5 != 0x8e45) | 0x1906;
  }
  if (bVar4 == false) {
    pTVar2 = ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"Initial","");
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Initial","");
    tcu::ScopedLogSection::ScopedLogSection(&local_d8,pTVar2,&local_f8,&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    StateQueryUtil::verifyStateTextureParamInteger
              (local_58,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
               uVar1,(this->super_TextureTest).m_type);
    tcu::TestLog::endSection(local_d8.m_log);
  }
  pTVar2 = ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"Set","");
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Set","");
  tcu::ScopedLogSection::ScopedLogSection(&local_38,pTVar2,&local_f8,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if (bVar4 == false) {
    lVar11 = 0;
    do {
      param = *(GLint *)((long)&DAT_01cad220 + lVar11);
      glu::CallLogWrapper::glTexParameteri
                (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,param);
      GVar5 = glu::CallLogWrapper::glGetError(gl);
      if (GVar5 != 0) {
        local_98 = local_88;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Got Error ","");
        local_48 = glu::getErrorName;
        local_40 = GVar5;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_78,&local_48);
        uVar9 = 0xf;
        if (local_98 != local_88) {
          uVar9 = local_88[0];
        }
        if (uVar9 < local_78._M_string_length + local_90) {
          uVar10 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            uVar10 = local_78.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar10 < local_78._M_string_length + local_90) goto LAB_0182c493;
          plVar6 = (long *)std::__cxx11::string::replace
                                     ((ulong)&local_78,0,(char *)0x0,(ulong)local_98);
        }
        else {
LAB_0182c493:
          plVar6 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_98,(ulong)local_78._M_dataplus._M_p);
        }
        local_d8.m_log = &local_c8;
        pTVar2 = (TestLog *)(plVar6 + 2);
        if ((TestLog *)*plVar6 == pTVar2) {
          local_c8.m_log = pTVar2->m_log;
          lStack_c0 = plVar6[3];
        }
        else {
          local_c8.m_log = pTVar2->m_log;
          local_d8.m_log = (TestLog *)*plVar6;
        }
        local_d0 = plVar6[1];
        *plVar6 = (long)pTVar2;
        plVar6[1] = 0;
        *(undefined1 *)&pTVar2->m_log = 0;
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_d8);
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        psVar8 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_b8.field_2._M_allocated_capacity = *psVar8;
          local_b8.field_2._8_8_ = puVar7[3];
        }
        else {
          local_b8.field_2._M_allocated_capacity = *psVar8;
          local_b8._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_b8._M_string_length = puVar7[1];
        *puVar7 = psVar8;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_b8);
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        psVar8 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_f8.field_2._M_allocated_capacity = *psVar8;
          local_f8.field_2._8_8_ = plVar6[3];
        }
        else {
          local_f8.field_2._M_allocated_capacity = *psVar8;
          local_f8._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_f8._M_string_length = plVar6[1];
        *plVar6 = (long)psVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        tcu::ResultCollector::fail(local_58,&local_f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if (local_d8.m_log != &local_c8) {
          operator_delete(local_d8.m_log,(ulong)((long)&(local_c8.m_log)->flags + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        if (local_98 != local_88) {
          operator_delete(local_98,local_88[0] + 1);
        }
      }
      StateQueryUtil::verifyStateTextureParamInteger
                (local_58,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                 param,(this->super_TextureTest).m_type);
      lVar11 = lVar11 + 4;
    } while (lVar11 != 0x18);
    lVar11 = 0;
    do {
      uVar1 = *(uint *)((long)&DAT_01cad220 + lVar11);
      glu::CallLogWrapper::glTexParameterf
                (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                 (float)uVar1);
      GVar5 = glu::CallLogWrapper::glGetError(gl);
      if (GVar5 != 0) {
        local_98 = local_88;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Got Error ","");
        local_48 = glu::getErrorName;
        local_40 = GVar5;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_78,&local_48);
        uVar9 = 0xf;
        if (local_98 != local_88) {
          uVar9 = local_88[0];
        }
        if (uVar9 < local_78._M_string_length + local_90) {
          uVar10 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            uVar10 = local_78.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar10 < local_78._M_string_length + local_90) goto LAB_0182c74e;
          plVar6 = (long *)std::__cxx11::string::replace
                                     ((ulong)&local_78,0,(char *)0x0,(ulong)local_98);
        }
        else {
LAB_0182c74e:
          plVar6 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_98,(ulong)local_78._M_dataplus._M_p);
        }
        local_d8.m_log = &local_c8;
        pTVar2 = (TestLog *)(plVar6 + 2);
        if ((TestLog *)*plVar6 == pTVar2) {
          local_c8.m_log = pTVar2->m_log;
          lStack_c0 = plVar6[3];
        }
        else {
          local_c8.m_log = pTVar2->m_log;
          local_d8.m_log = (TestLog *)*plVar6;
        }
        local_d0 = plVar6[1];
        *plVar6 = (long)pTVar2;
        plVar6[1] = 0;
        *(undefined1 *)&pTVar2->m_log = 0;
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_d8);
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        psVar8 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_b8.field_2._M_allocated_capacity = *psVar8;
          local_b8.field_2._8_8_ = puVar7[3];
        }
        else {
          local_b8.field_2._M_allocated_capacity = *psVar8;
          local_b8._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_b8._M_string_length = puVar7[1];
        *puVar7 = psVar8;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_b8);
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        psVar8 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_f8.field_2._M_allocated_capacity = *psVar8;
          local_f8.field_2._8_8_ = plVar6[3];
        }
        else {
          local_f8.field_2._M_allocated_capacity = *psVar8;
          local_f8._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_f8._M_string_length = plVar6[1];
        *plVar6 = (long)psVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        tcu::ResultCollector::fail(local_58,&local_f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if (local_d8.m_log != &local_c8) {
          operator_delete(local_d8.m_log,(ulong)((long)&(local_c8.m_log)->flags + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        if (local_98 != local_88) {
          operator_delete(local_98,local_88[0] + 1);
        }
      }
      StateQueryUtil::verifyStateTextureParamInteger
                (local_58,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                 uVar1,(this->super_TextureTest).m_type);
      lVar11 = lVar11 + 4;
    } while (lVar11 != 0x18);
  }
  else {
    lVar11 = 0;
    do {
      bVar3 = isPureIntTester((this->super_TextureTest).m_tester);
      if (bVar3) {
        expected = *(GLuint *)((long)&DAT_01cad220 + lVar11);
        local_4c = expected;
        glu::CallLogWrapper::glTexParameterIiv
                  (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                   (GLint *)&local_4c);
        GVar5 = glu::CallLogWrapper::glGetError(gl);
        if (GVar5 != 0) {
          local_98 = local_88;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Got Error ","");
          local_48 = glu::getErrorName;
          local_40 = GVar5;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_78,&local_48);
          uVar9 = 0xf;
          if (local_98 != local_88) {
            uVar9 = local_88[0];
          }
          if (uVar9 < local_78._M_string_length + local_90) {
            uVar10 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              uVar10 = local_78.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar10 < local_78._M_string_length + local_90) goto LAB_0182bfce;
            plVar6 = (long *)std::__cxx11::string::replace
                                       ((ulong)&local_78,0,(char *)0x0,(ulong)local_98);
          }
          else {
LAB_0182bfce:
            plVar6 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_98,(ulong)local_78._M_dataplus._M_p);
          }
          pTVar2 = (TestLog *)(plVar6 + 2);
          if ((TestLog *)*plVar6 == pTVar2) {
            local_c8.m_log = pTVar2->m_log;
            lStack_c0 = plVar6[3];
            local_d8.m_log = &local_c8;
          }
          else {
            local_c8.m_log = pTVar2->m_log;
            local_d8.m_log = (TestLog *)*plVar6;
          }
          local_d0 = plVar6[1];
          *plVar6 = (long)pTVar2;
          plVar6[1] = 0;
          *(undefined1 *)&pTVar2->m_log = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_d8);
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          psVar8 = (size_type *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_b8.field_2._M_allocated_capacity = *psVar8;
            local_b8.field_2._8_8_ = plVar6[3];
          }
          else {
            local_b8.field_2._M_allocated_capacity = *psVar8;
            local_b8._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_b8._M_string_length = plVar6[1];
          *plVar6 = (long)psVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_b8);
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          psVar8 = (size_type *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_f8.field_2._M_allocated_capacity = *psVar8;
            local_f8.field_2._8_8_ = plVar6[3];
          }
          else {
            local_f8.field_2._M_allocated_capacity = *psVar8;
            local_f8._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_f8._M_string_length = plVar6[1];
          *plVar6 = (long)psVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          tcu::ResultCollector::fail(local_58,&local_f8);
          goto LAB_0182c2f7;
        }
      }
      else {
        expected = *(GLuint *)((long)&DAT_01cad220 + lVar11);
        local_4c = expected;
        glu::CallLogWrapper::glTexParameterIuiv
                  (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,&local_4c
                  );
        GVar5 = glu::CallLogWrapper::glGetError(gl);
        if (GVar5 == 0) goto LAB_0182c386;
        local_98 = local_88;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"Got Error ","");
        local_48 = glu::getErrorName;
        local_40 = GVar5;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_78,&local_48);
        uVar9 = 0xf;
        if (local_98 != local_88) {
          uVar9 = local_88[0];
        }
        if (uVar9 < local_78._M_string_length + local_90) {
          uVar10 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            uVar10 = local_78.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar10 < local_78._M_string_length + local_90) goto LAB_0182c0c3;
          plVar6 = (long *)std::__cxx11::string::replace
                                     ((ulong)&local_78,0,(char *)0x0,(ulong)local_98);
        }
        else {
LAB_0182c0c3:
          plVar6 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_98,(ulong)local_78._M_dataplus._M_p);
        }
        pTVar2 = (TestLog *)(plVar6 + 2);
        if ((TestLog *)*plVar6 == pTVar2) {
          local_c8.m_log = pTVar2->m_log;
          lStack_c0 = plVar6[3];
          local_d8.m_log = &local_c8;
        }
        else {
          local_c8.m_log = pTVar2->m_log;
          local_d8.m_log = (TestLog *)*plVar6;
        }
        local_d0 = plVar6[1];
        *plVar6 = (long)pTVar2;
        plVar6[1] = 0;
        *(undefined1 *)&pTVar2->m_log = 0;
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_d8);
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        psVar8 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_b8.field_2._M_allocated_capacity = *psVar8;
          local_b8.field_2._8_8_ = puVar7[3];
        }
        else {
          local_b8.field_2._M_allocated_capacity = *psVar8;
          local_b8._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_b8._M_string_length = puVar7[1];
        *puVar7 = psVar8;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_b8);
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        psVar8 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_f8.field_2._M_allocated_capacity = *psVar8;
          local_f8.field_2._8_8_ = plVar6[3];
        }
        else {
          local_f8.field_2._M_allocated_capacity = *psVar8;
          local_f8._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_f8._M_string_length = plVar6[1];
        *plVar6 = (long)psVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        tcu::ResultCollector::fail(local_58,&local_f8);
LAB_0182c2f7:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if (local_d8.m_log != &local_c8) {
          operator_delete(local_d8.m_log,(ulong)((long)&(local_c8.m_log)->flags + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        if (local_98 != local_88) {
          operator_delete(local_98,local_88[0] + 1);
        }
      }
LAB_0182c386:
      StateQueryUtil::verifyStateTextureParamInteger
                (local_58,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                 expected,(this->super_TextureTest).m_type);
      lVar11 = lVar11 + 4;
    } while (lVar11 != 0x18);
  }
  tcu::TestLog::endSection(local_38.m_log);
  return;
}

Assistant:

void TextureSwizzleCase::test (glu::CallLogWrapper& gl, tcu::ResultCollector& result) const
{
	const bool	isPureCase		= isPureIntTester(m_tester) || isPureUintTester(m_tester);
	const int	initialValue	= (m_pname == GL_TEXTURE_SWIZZLE_R) ? (GL_RED) :
								  (m_pname == GL_TEXTURE_SWIZZLE_G) ? (GL_GREEN) :
								  (m_pname == GL_TEXTURE_SWIZZLE_B) ? (GL_BLUE) :
								  (m_pname == GL_TEXTURE_SWIZZLE_A) ? (GL_ALPHA) :
								  (-1);

	if (!isPureCase)
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Initial", "Initial");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, initialValue, m_type);
	}

	{
		const tcu::ScopedLogSection	section			(m_testCtx.getLog(), "Set", "Set");
		const GLenum				swizzleValues[]	= {GL_RED, GL_GREEN, GL_BLUE, GL_ALPHA, GL_ZERO, GL_ONE};

		if (isPureCase)
		{
			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(swizzleValues); ++ndx)
			{
				if (isPureIntTester(m_tester))
				{
					const glw::GLint value = (glw::GLint)swizzleValues[ndx];
					gl.glTexParameterIiv(m_target, m_pname, &value);
					GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterIiv");
				}
				else
				{
					DE_ASSERT(isPureUintTester(m_tester));

					const glw::GLuint value = swizzleValues[ndx];
					gl.glTexParameterIuiv(m_target, m_pname, &value);
					GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterIuiv");
				}

				verifyStateTextureParamInteger(result, gl, m_target, m_pname, swizzleValues[ndx], m_type);
			}
		}
		else
		{
			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(swizzleValues); ++ndx)
			{
				gl.glTexParameteri(m_target, m_pname, swizzleValues[ndx]);
				GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameteri");

				verifyStateTextureParamInteger(result, gl, m_target, m_pname, swizzleValues[ndx], m_type);
			}

			//check unit conversions with float

			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(swizzleValues); ++ndx)
			{
				gl.glTexParameterf(m_target, m_pname, (GLfloat)swizzleValues[ndx]);
				GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterf");

				verifyStateTextureParamInteger(result, gl, m_target, m_pname, swizzleValues[ndx], m_type);
			}
		}
	}
}